

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

bool __thiscall duckdb::LineReader::NextLine(LineReader *this)

{
  ulong len;
  bool bVar1;
  idx_t iVar2;
  size_t __n;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    while( true ) {
      iVar2 = GetNextNewline(this);
      __n = iVar2 - this->position;
      len = __n + uVar3;
      if (0x32000 < len) break;
      switchD_00917c1c::default(this->line_buffer + uVar3,this->data_buffer + this->position,__n);
      if (iVar2 < this->capacity) {
        *(undefined1 *)((long)this + len + 0x10) = 0;
        this->position = iVar2 + 1;
        if (this->data_buffer[iVar2] == '\r') {
          SkipNewline(this);
        }
        uVar3 = 0;
        if (len != 0) {
          bVar1 = Utf8Proc::IsValid(this->line_buffer,len);
          uVar3 = 0;
          if (bVar1) {
            return true;
          }
        }
      }
      else {
        FillBuffer(this);
        uVar3 = len;
        if (this->capacity == 0) {
          return len != 0;
        }
      }
    }
    bVar1 = false;
    while (!bVar1) {
      if (this->capacity == 0) {
        return false;
      }
      iVar2 = GetNextNewline(this);
      if (iVar2 < this->capacity) {
        bVar1 = true;
      }
      if (!bVar1) {
        FillBuffer(this);
      }
    }
    this->position = iVar2 + 1;
    if (this->data_buffer[iVar2] == '\r') {
      SkipNewline(this);
    }
  } while( true );
}

Assistant:

bool NextLine() {
		idx_t line_size = 0;
		while (true) {
			// find the next newline in the current buffer (if any)
			idx_t i = GetNextNewline();
			// copy over the data and move to the next byte
			idx_t read_count = i - position;
			if (line_size + read_count > LINENOISE_MAX_LINE) {
				// exceeded max line size
				// move on to next line and don't add to history
				// skip to next newline
				bool found_next_newline = false;
				while (!found_next_newline && capacity > 0) {
					i = GetNextNewline();
					if (i < capacity) {
						found_next_newline = true;
					}
					if (!found_next_newline) {
						// read more data
						FillBuffer();
					}
				}
				if (!found_next_newline) {
					// no newline found - skip
					return false;
				}
				// newline found - adjust position and read next line
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				continue;
			}
			memcpy(line_buffer + line_size, data_buffer + position, read_count);
			line_size += read_count;

			if (i < capacity) {
				// we're still within the buffer - this means we found a newline in the buffer
				line_buffer[line_size] = '\0';
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				if (line_size == 0 || !Utf8Proc::IsValid(line_buffer, line_size)) {
					// line is empty OR not valid UTF8
					// move on to next line and don't add to history
					line_size = 0;
					continue;
				}
				return true;
			}
			// we need to read more data - fill up the buffer
			FillBuffer();
			if (capacity == 0) {
				// no more data available - return true if there is anything we copied over (i.e. part of the next line)
				return line_size > 0;
			}
		}
	}